

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

void Io_MvSplitIntoTokensAndClear(Vec_Ptr_t *vTokens,char *pLine,char Stop,char Char)

{
  char cVar1;
  char *pOutput;
  char *pCur;
  
  pOutput = pLine;
  do {
    cVar1 = *pOutput;
    if (((cVar1 == '\t') || (cVar1 == '\r')) || (cVar1 == ' ')) {
LAB_006dedb0:
      *pOutput = '\0';
    }
    else {
      if (cVar1 == '\0') {
        Io_MvCollectTokens(vTokens,pLine,pOutput);
        return;
      }
      if (cVar1 == '\n' || cVar1 == Stop) goto LAB_006dedb0;
    }
    pOutput = pOutput + 1;
  } while( true );
}

Assistant:

static void Io_MvSplitIntoTokensAndClear( Vec_Ptr_t * vTokens, char * pLine, char Stop, char Char )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != Stop; pCur++ )
        if ( Io_MvCharIsSpace(*pCur) || *pCur == Char )
            *pCur = 0;
    // collect tokens
    Io_MvCollectTokens( vTokens, pLine, pCur );
}